

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-dtoa.cc
# Opt level: O3

bool __thiscall
double_conversion::FastDtoa
          (double_conversion *this,double v,FastDtoaMode mode,int requested_digits,
          Vector<char> buffer,int *length,int *decimal_point)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  byte bVar7;
  byte bVar8;
  undefined4 in_register_00000014;
  long lVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int *piVar14;
  ulong uVar15;
  uint uVar16;
  uint64_t uVar17;
  uint64_t unit;
  ulong uVar18;
  FastDtoaMode FVar19;
  uint64_t uVar20;
  uint uVar21;
  DiyFp DVar22;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  DiyFp ten_mk;
  DiyFp boundary_plus;
  DiyFp boundary_minus;
  int *in_stack_ffffffffffffff78;
  int local_74;
  DiyFp local_70;
  DiyFp local_60;
  DiyFp local_50;
  uint64_t local_40;
  int *local_38;
  
  lVar9 = CONCAT44(in_register_00000014,requested_digits);
  piVar14 = buffer._8_8_;
  uVar21 = (uint)this;
  local_50.f_ = (uint64_t)v;
  local_38 = length;
  if (uVar21 < 2) {
    DVar22 = Double::AsNormalizedDiyFp((Double *)&local_50);
    iVar3 = DVar22.e_;
    local_50.f_ = 0;
    local_50.e_ = 0;
    local_60.f_ = 0;
    local_60.e_ = 0;
    if (uVar21 == 0) {
      local_70.f_ = (uint64_t)v;
      Double::NormalizedBoundaries((Double *)&local_70,&local_50,&local_60);
    }
    else {
      local_70.f_ = CONCAT44(local_70.f_._4_4_,(float)v);
      Single::NormalizedBoundaries((Single *)&local_70,&local_50,&local_60);
    }
    local_70.f_ = 0;
    iVar10 = 0;
    local_70.e_ = 0;
    PowersOfTenCache::GetCachedPowerForBinaryExponentRange
              (-0x7c - iVar3,-0x60 - iVar3,&local_70,&local_74);
    uVar11 = DVar22.f_ >> 0x20;
    uVar5 = DVar22.f_ & 0xffffffff;
    uVar15 = local_70.f_ & 0xffffffff;
    uVar4 = local_70.f_ >> 0x20;
    uVar13 = uVar4 * uVar5;
    uVar12 = uVar11 * uVar15;
    unit = ((uVar13 & 0xffffffff) + (uVar12 & 0xffffffff) + (uVar5 * uVar15 >> 0x20) + 0x80000000 >>
           0x20) + (uVar13 >> 0x20) + (uVar12 >> 0x20) + uVar4 * uVar11;
    uVar13 = (local_50.f_ & 0xffffffff) * uVar4;
    uVar11 = (local_50.f_ >> 0x20) * uVar15;
    uVar5 = uVar4 * (local_60.f_ & 0xffffffff);
    uVar12 = (local_60.f_ >> 0x20) * uVar15;
    lVar6 = (uVar5 >> 0x20) + (uVar12 >> 0x20) + (local_60.f_ >> 0x20) * uVar4;
    uVar12 = (uVar5 & 0xffffffff) +
             (uVar12 & 0xffffffff) + ((local_60.f_ & 0xffffffff) * uVar15 >> 0x20) + 0x80000000 >>
             0x20;
    uVar18 = uVar12 + lVar6 + 1;
    cVar1 = (char)(local_70.e_ + iVar3);
    bVar7 = -cVar1 - 0x40;
    bVar8 = -cVar1;
    uVar17 = 1L << (bVar8 & 0x3f);
    uVar5 = uVar18 >> (bVar8 & 0x3f);
    uVar4 = ((lVar6 + uVar12) -
            (((uVar13 & 0xffffffff) +
              (uVar11 & 0xffffffff) + ((local_50.f_ & 0xffffffff) * uVar15 >> 0x20) + 0x80000000 >>
             0x20) + (uVar13 >> 0x20) + (uVar11 >> 0x20) + (local_50.f_ >> 0x20) * uVar4)) + 2;
    uVar15 = uVar18 & uVar17 - 1;
    iVar3 = (local_70.e_ + iVar3) * 0x4d1 + 0x26d51 >> 0xc;
    uVar20 = 1;
    if (*(uint *)(kSmallPowersOfTen + (long)iVar3 * 4 + 4) <= (uint)uVar5) {
      iVar3 = iVar3 + 1;
    }
    uVar11 = (ulong)*(uint *)(kSmallPowersOfTen + (long)iVar3 * 4);
    *piVar14 = 0;
    if (0 < iVar3) {
      uVar21 = iVar3 + 1;
      iVar10 = 0;
      do {
        uVar12 = uVar5 & 0xffffffff;
        uVar5 = uVar12 % uVar11;
        *(char *)(lVar9 + iVar10) = (char)(uVar12 / uVar11) + '0';
        iVar10 = *piVar14 + 1;
        *piVar14 = iVar10;
        uVar12 = (uVar5 << (bVar7 & 0x3f)) + uVar15;
        local_40 = uVar17;
        if (uVar12 < uVar4) {
          buffer_01.length_ = iVar10;
          buffer_01.start_ = (char *)lVar9;
          buffer_01._12_4_ = 0;
          bVar2 = RoundWeed(buffer_01,(int)uVar18 - (int)unit,uVar4,uVar12,uVar11 << (bVar7 & 0x3f),
                            1,unit);
          if (!bVar2) goto LAB_0087a2aa;
          iVar3 = (uVar21 - local_74) + -2;
          goto LAB_0087a294;
        }
        uVar11 = uVar11 / 10;
        uVar21 = uVar21 - 1;
      } while (1 < uVar21);
      iVar3 = 0;
    }
    do {
      uVar20 = uVar20 * 10;
      uVar4 = uVar4 * 10;
      *(char *)(lVar9 + iVar10) = (char)(uVar15 * 10 >> (bVar7 & 0x3f)) + '0';
      iVar10 = *piVar14 + 1;
      *piVar14 = iVar10;
      uVar15 = uVar15 * 10 & uVar17 - 1;
      iVar3 = iVar3 + -1;
    } while (uVar4 <= uVar15);
    buffer_00.length_ = iVar10;
    buffer_00.start_ = (char *)lVar9;
    buffer_00._12_4_ = 0;
    bVar2 = RoundWeed(buffer_00,((int)uVar18 - (int)unit) * (int)uVar20,uVar4,uVar15,uVar17,uVar20,
                      unit);
    if (!bVar2) goto LAB_0087a2aa;
    iVar3 = iVar3 - local_74;
LAB_0087a294:
    *local_38 = iVar3 + *piVar14;
    *(undefined1 *)(lVar9 + *piVar14) = 0;
    bVar2 = true;
  }
  else {
    if (uVar21 != 2) {
      abort();
    }
    DVar22 = Double::AsNormalizedDiyFp((Double *)&local_50);
    uVar20 = DVar22.f_;
    iVar3 = DVar22.e_;
    local_50.f_ = 0;
    iVar10 = 0;
    local_50.e_ = 0;
    PowersOfTenCache::GetCachedPowerForBinaryExponentRange
              (-0x7c - iVar3,-0x60 - iVar3,&local_50,(int *)&local_60);
    uVar5 = (local_50.f_ >> 0x20) * (uVar20 & 0xffffffff);
    uVar4 = (uVar20 >> 0x20) * (local_50.f_ & 0xffffffff);
    cVar1 = (char)(iVar3 + local_50.e_);
    bVar7 = -cVar1 - 0x40;
    bVar8 = -cVar1;
    uVar17 = 1L << (bVar8 & 0x3f);
    uVar4 = ((uVar5 & 0xffffffff) +
             (uVar4 & 0xffffffff) + ((local_50.f_ & 0xffffffff) * (uVar20 & 0xffffffff) >> 0x20) +
             0x80000000 >> 0x20) +
            (uVar5 >> 0x20) + (uVar4 >> 0x20) + (local_50.f_ >> 0x20) * (uVar20 >> 0x20);
    uVar5 = uVar4 >> (bVar8 & 0x3f);
    uVar4 = uVar4 & uVar17 - 1;
    local_70.f_._0_4_ = (iVar3 + local_50.e_) * 0x4d1 + 0x26d51 >> 0xc;
    uVar21 = (uint)uVar5;
    if (*(uint *)(kSmallPowersOfTen + (long)(int)(uint)local_70.f_ * 4 + 4) <= uVar21) {
      local_70.f_._0_4_ = (uint)local_70.f_ + 1;
    }
    uVar15 = (ulong)*(uint *)(kSmallPowersOfTen + (long)(int)(uint)local_70.f_ * 4);
    *piVar14 = 0;
    if (0 < (int)(uint)local_70.f_) {
      iVar10 = 0;
      uVar16 = (uint)local_70.f_;
      do {
        uVar11 = uVar5 & 0xffffffff;
        uVar5 = uVar11 % uVar15;
        uVar21 = (uint)uVar5;
        *(char *)(lVar9 + iVar10) = (char)(uVar11 / uVar15) + '0';
        iVar10 = *piVar14 + 1;
        *piVar14 = iVar10;
        local_70.f_._0_4_ = uVar16 - 1;
        if (mode == FAST_DTOA_SHORTEST_SINGLE) goto LAB_0087a25e;
        uVar15 = uVar15 / 10;
        mode = mode - FAST_DTOA_SHORTEST_SINGLE;
        bVar2 = 1 < uVar16;
        uVar16 = (uint)local_70.f_;
      } while (bVar2);
    }
    if (mode == FAST_DTOA_SHORTEST) {
LAB_0087a25e:
      iVar3 = (uVar21 << (bVar7 & 0x3f)) + (int)uVar4;
      uVar17 = uVar15 << (bVar7 & 0x3f);
      uVar5 = 1;
LAB_0087a281:
      buffer_02.length_ = iVar10;
      buffer_02.start_ = (char *)lVar9;
      buffer_02._12_4_ = 0;
      bVar2 = RoundWeedCounted(buffer_02,iVar3,uVar17,uVar5,(uint64_t)&local_70,
                               in_stack_ffffffffffffff78);
      if (bVar2) {
        iVar3 = (uint)local_70.f_ - (int)local_60.f_;
        goto LAB_0087a294;
      }
    }
    else if ((0 < (int)mode) && (1 < uVar4)) {
      uVar5 = 1;
      do {
        uVar5 = uVar5 * 10;
        *(char *)(lVar9 + iVar10) = (char)(uVar4 * 10 >> (bVar7 & 0x3f)) + '0';
        iVar10 = *piVar14 + 1;
        *piVar14 = iVar10;
        FVar19 = mode - FAST_DTOA_SHORTEST_SINGLE;
        uVar4 = uVar4 * 10 & uVar17 - 1;
        local_70.f_._0_4_ = (uint)local_70.f_ - 1;
        if (mode < FAST_DTOA_PRECISION) break;
        mode = FVar19;
      } while (uVar5 < uVar4);
      if (FVar19 == FAST_DTOA_SHORTEST) {
        iVar3 = (int)uVar4;
        goto LAB_0087a281;
      }
    }
LAB_0087a2aa:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool FastDtoa(double v,
              FastDtoaMode mode,
              int requested_digits,
              Vector<char> buffer,
              int* length,
              int* decimal_point) {
  DOUBLE_CONVERSION_ASSERT(v > 0);
  DOUBLE_CONVERSION_ASSERT(!Double(v).IsSpecial());

  bool result = false;
  int decimal_exponent = 0;
  switch (mode) {
    case FAST_DTOA_SHORTEST:
    case FAST_DTOA_SHORTEST_SINGLE:
      result = Grisu3(v, mode, buffer, length, &decimal_exponent);
      break;
    case FAST_DTOA_PRECISION:
      result = Grisu3Counted(v, requested_digits,
                             buffer, length, &decimal_exponent);
      break;
    default:
      DOUBLE_CONVERSION_UNREACHABLE();
  }
  if (result) {
    *decimal_point = *length + decimal_exponent;
    buffer[*length] = '\0';
  }
  return result;
}